

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O2

void __thiscall
hacd::vector<HACD::HACD_API::Hull>::recreate(vector<HACD::HACD_API::Hull> *this,HaU32 capacity)

{
  Hull *pHVar1;
  undefined8 *puVar2;
  uint uVar3;
  Hull *pHVar4;
  undefined8 uVar5;
  HaF32 *pHVar6;
  Hull *pHVar7;
  long lVar8;
  
  pHVar7 = allocate(this,capacity);
  pHVar4 = this->mData;
  if ((capacity != 0) && ((pHVar7 == (Hull *)0x0 || (pHVar7 == pHVar4)))) {
    __assert_fail("!capacity || newData && newData != mData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                  ,0x23b,
                  "void hacd::vector<HACD::HACD_API::Hull>::recreate(HaU32) [T = HACD::HACD_API::Hull]"
                 );
  }
  uVar3 = this->mSize;
  for (lVar8 = 0; pHVar1 = (Hull *)((long)&pHVar7->mTriangleCount + lVar8), pHVar1 < pHVar7 + uVar3;
      lVar8 = lVar8 + 0x18) {
    puVar2 = (undefined8 *)((long)&pHVar4->mTriangleCount + lVar8);
    pHVar1->mIndices = (HaU32 *)puVar2[2];
    uVar5 = *puVar2;
    pHVar6 = (HaF32 *)puVar2[1];
    pHVar1->mTriangleCount = (int)uVar5;
    pHVar1->mVertexCount = (int)((ulong)uVar5 >> 0x20);
    pHVar1->mVertices = pHVar6;
  }
  if (-1 < (int)this->mCapacity) {
    free(this->mData);
  }
  this->mData = pHVar7;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}